

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastEntityStatePdu.cpp
# Opt level: O0

void __thiscall DIS::FastEntityStatePdu::~FastEntityStatePdu(FastEntityStatePdu *this)

{
  FastEntityStatePdu *this_local;
  
  (this->super_EntityInformationFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__FastEntityStatePdu_00271ff8;
  std::vector<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>::clear
            (&this->_articulationParameters);
  std::vector<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>::~vector
            (&this->_articulationParameters);
  EntityInformationFamilyPdu::~EntityInformationFamilyPdu(&this->super_EntityInformationFamilyPdu);
  return;
}

Assistant:

FastEntityStatePdu::~FastEntityStatePdu()
{
    _articulationParameters.clear();
}